

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

void __thiscall
QProgressDialogPrivate::setCancelButtonText(QProgressDialogPrivate *this,QString *cancelButtonText)

{
  bool bVar1;
  QProgressDialogPrivate *this_00;
  QString *text;
  QProgressDialog *in_RSI;
  QProgressDialogPrivate *in_RDI;
  QProgressDialog *q;
  QProgressDialogPrivate *in_stack_ffffffffffffffd0;
  QAbstractButton *in_stack_ffffffffffffffd8;
  QProgressDialogPrivate *cancelButton;
  
  this_00 = (QProgressDialogPrivate *)q_func(in_RDI);
  bVar1 = QString::isNull((QString *)0x7b0f00);
  if (bVar1) {
    QProgressDialog::setCancelButton(in_RSI,(QPushButton *)this_00);
    this_00 = in_stack_ffffffffffffffd0;
  }
  else if (in_RDI->cancel == (QPushButton *)0x0) {
    cancelButton = this_00;
    text = (QString *)operator_new(0x28);
    QPushButton::QPushButton((QPushButton *)in_RDI,text,(QWidget *)this_00);
    QProgressDialog::setCancelButton(in_RSI,(QPushButton *)cancelButton);
  }
  else {
    QAbstractButton::setText(in_stack_ffffffffffffffd8,(QString *)in_stack_ffffffffffffffd0);
    this_00 = in_stack_ffffffffffffffd0;
  }
  ensureSizeIsAtLeastSizeHint(this_00);
  return;
}

Assistant:

void QProgressDialogPrivate::setCancelButtonText(const QString &cancelButtonText)
{
    Q_Q(QProgressDialog);

    if (!cancelButtonText.isNull()) {
        if (cancel) {
            cancel->setText(cancelButtonText);
        } else {
            q->setCancelButton(new QPushButton(cancelButtonText, q));
        }
    } else {
        q->setCancelButton(nullptr);
    }
    ensureSizeIsAtLeastSizeHint();
}